

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O3

void Acec_InsertFadd(Gia_Man_t *pNew,int *In,int *Out)

{
  uint uVar1;
  int Out2 [2];
  int Out1 [2];
  int In2 [2];
  int local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  
  Acec_InsertHadd(pNew,In,&local_30);
  local_28 = local_30;
  local_24 = In[2];
  Acec_InsertHadd(pNew,&local_28,&local_38);
  *Out = local_38;
  if ((-1 < (int)local_2c) && (-1 < (int)local_34)) {
    uVar1 = Gia_ManAppendAnd2(pNew,local_2c ^ 1,local_34 ^ 1);
    if (-1 < (int)uVar1) {
      Out[1] = uVar1 ^ 1;
      return;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

void Acec_InsertFadd( Gia_Man_t * pNew, int In[3], int Out[2] )
{
    int In2[2], Out1[2], Out2[2];
    Acec_InsertHadd( pNew, In, Out1 );
    In2[0] = Out1[0];
    In2[1] = In[2];
    Acec_InsertHadd( pNew, In2, Out2 );
    Out[0] = Out2[0];
    Out[1] = Gia_ManAppendOr2( pNew, Out1[1], Out2[1] );
}